

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_init_custom(nk_context *ctx,nk_buffer *cmds,nk_buffer *pool,nk_user_font *font)

{
  nk_page *pnVar1;
  ulong uVar2;
  nk_plugin_alloc p_Var3;
  undefined4 uVar4;
  long lVar5;
  nk_buffer *pnVar6;
  byte bVar7;
  
  bVar7 = 0;
  if (cmds == (nk_buffer *)0x0) {
    __assert_fail("cmds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3a3f,
                  "int nk_init_custom(struct nk_context *, struct nk_buffer *, struct nk_buffer *, const struct nk_user_font *)"
                 );
  }
  if (pool != (nk_buffer *)0x0) {
    nk_setup(ctx,font);
    pnVar6 = &ctx->memory;
    for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
      uVar4 = *(undefined4 *)&cmds->marker[0].field_0x4;
      pnVar6->marker[0].active = cmds->marker[0].active;
      *(undefined4 *)&pnVar6->marker[0].field_0x4 = uVar4;
      cmds = (nk_buffer *)((long)cmds + (ulong)bVar7 * -0x10 + 8);
      pnVar6 = (nk_buffer *)((long)pnVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    if (pool->type == NK_BUFFER_FIXED) {
      pnVar1 = (nk_page *)(pool->memory).ptr;
      uVar2 = (pool->memory).size;
      nk_zero(&ctx->pool,0x48);
      if (uVar2 < 0x210) {
        __assert_fail("size >= sizeof(struct nk_page)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                      ,0x3b8b,"void nk_pool_init_fixed(struct nk_pool *, void *, nk_size)");
      }
      (ctx->pool).capacity = (int)uVar2 - 0x210U >> 9;
      (ctx->pool).pages = pnVar1;
      (ctx->pool).type = NK_BUFFER_FIXED;
      (ctx->pool).size = uVar2;
    }
    else {
      nk_zero(&ctx->pool,0x48);
      (ctx->pool).alloc.free = (pool->pool).free;
      p_Var3 = (pool->pool).alloc;
      (ctx->pool).alloc.userdata = (pool->pool).userdata;
      (ctx->pool).alloc.alloc = p_Var3;
      (ctx->pool).capacity = 0x10;
      (ctx->pool).type = NK_BUFFER_DYNAMIC;
      (ctx->pool).pages = (nk_page *)0x0;
    }
    ctx->use_pool = 1;
    return 1;
  }
  __assert_fail("pool",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x3a40,
                "int nk_init_custom(struct nk_context *, struct nk_buffer *, struct nk_buffer *, const struct nk_user_font *)"
               );
}

Assistant:

NK_API int
nk_init_custom(struct nk_context *ctx, struct nk_buffer *cmds,
    struct nk_buffer *pool, const struct nk_user_font *font)
{
    NK_ASSERT(cmds);
    NK_ASSERT(pool);
    if (!cmds || !pool) return 0;

    nk_setup(ctx, font);
    ctx->memory = *cmds;
    if (pool->type == NK_BUFFER_FIXED) {
        /* take memory from buffer and alloc fixed pool */
        nk_pool_init_fixed(&ctx->pool, pool->memory.ptr, pool->memory.size);
    } else {
        /* create dynamic pool from buffer allocator */
        struct nk_allocator *alloc = &pool->pool;
        nk_pool_init(&ctx->pool, alloc, NK_POOL_DEFAULT_CAPACITY);
    }
    ctx->use_pool = nk_true;
    return 1;
}